

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fct_clp__add_options(fct_clp_t *clp,fctcl_init_t *options)

{
  fctcl_store_t fVar1;
  fctcl_t *clo;
  char *pcVar2;
  
  fVar1 = options->action;
  do {
    if (fVar1 == FCTCL_STORE_UNDEFINED) {
      return 1;
    }
    clo = (fctcl_t *)calloc(1,0x28);
    if (clo == (fctcl_t *)0x0) {
LAB_00103e6f:
      clo = (fctcl_t *)0x0;
    }
    else {
      clo->action = fVar1;
      if (options->help != (char *)0x0) {
        pcVar2 = fctstr_clone(options->help);
        clo->help = pcVar2;
        if (pcVar2 != (char *)0x0) goto LAB_00103e2f;
LAB_00103e67:
        fctcl__del(clo);
        goto LAB_00103e6f;
      }
      clo->help = (char *)0x0;
LAB_00103e2f:
      if (options->long_opt == (char *)0x0) {
        clo->long_opt = (char *)0x0;
      }
      else {
        pcVar2 = fctstr_clone(options->long_opt);
        clo->long_opt = pcVar2;
        if (pcVar2 == (char *)0x0) goto LAB_00103e67;
      }
      if (options->short_opt == (char *)0x0) {
        clo->short_opt = (char *)0x0;
      }
      else {
        pcVar2 = fctstr_clone(options->short_opt);
        clo->short_opt = pcVar2;
        if (pcVar2 == (char *)0x0) goto LAB_00103e67;
      }
    }
    if (clo == (fctcl_t *)0x0) {
      return 0;
    }
    fct_nlist__append(&clp->clo_list,clo);
    fVar1 = options[1].action;
    options = options + 1;
  } while( true );
}

Assistant:

static int
fct_clp__add_options(fct_clp_t *clp, fctcl_init_t const *options)
{
    fctcl_init_t const *pclo =NULL;
    int ok;
    for ( pclo = options; pclo->action != FCTCL_STORE_UNDEFINED; ++pclo )
    {
        fctcl_t *cpy = fctcl_new2(pclo);
        if ( cpy == NULL )
        {
            ok = 0;
            goto finally;
        }
        fct_nlist__append(&(clp->clo_list), (void*)cpy);
    }
    ok =1;
finally:
    return ok;
}